

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

int16_t __thiscall
helics::CommonCore::getIntegerProperty(CommonCore *this,LocalFederateId federateID,int32_t property)

{
  int16_t iVar1;
  int iVar2;
  FederateState *this_00;
  InvalidIdentifier *this_01;
  string_view message;
  
  if (federateID.fid == -0x103) {
    iVar1 = 0;
    switch(property) {
    case 0x10f:
    case 0x112:
      iVar1 = (int16_t)((this->super_BrokerBase).mLogManager.
                        super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       consoleLogLevel;
      break;
    case 0x110:
      iVar1 = (int16_t)((this->super_BrokerBase).mLogManager.
                        super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       fileLogLevel;
      break;
    case 0x114:
      iVar1 = (int16_t)(((this->super_BrokerBase).mLogManager.
                         super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->mLogBuffer).mMaxSize.super___atomic_base<unsigned_long>._M_i;
    }
  }
  else {
    this_00 = getFederateAt(this,federateID);
    if (this_00 == (FederateState *)0x0) {
      this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
      message._M_str = "federateID not valid (setTimeDelta)";
      message._M_len = 0x23;
      InvalidIdentifier::InvalidIdentifier(this_01,message);
      __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
    }
    iVar2 = FederateState::getIntegerProperty(this_00,property);
    iVar1 = (int16_t)iVar2;
  }
  return iVar1;
}

Assistant:

int16_t CommonCore::getIntegerProperty(LocalFederateId federateID, int32_t property) const
{
    if (federateID == gLocalCoreId) {
        if (property == HELICS_PROPERTY_INT_LOG_LEVEL ||
            property == HELICS_PROPERTY_INT_CONSOLE_LOG_LEVEL) {
            return mLogManager->getConsoleLevel();
        }
        if (property == HELICS_PROPERTY_INT_FILE_LOG_LEVEL) {
            return mLogManager->getFileLevel();
        }
        if (property == HELICS_PROPERTY_INT_LOG_BUFFER) {
            return static_cast<int16_t>(mLogManager->getLogBuffer().capacity());
        }
        return 0;
    }
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid (setTimeDelta)"));
    }
    return fed->getIntegerProperty(property);
}